

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tourmng.cpp
# Opt level: O0

vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> * __thiscall
banksia::TourMng::collectStats(TourMng *this)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  long in_RSI;
  vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>
  *s;
  iterator __end1_1;
  iterator __begin1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>_>
  *__range1_1;
  int lossCnt;
  iterator it;
  TourPlayer r;
  string name;
  int sd;
  MatchRecord *m;
  const_iterator __end1;
  const_iterator __begin1;
  vector<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_> *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>_>
  resultMap;
  vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *resultList;
  TourPlayer *in_stack_fffffffffffffea8;
  mapped_type *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  ResultType in_stack_fffffffffffffebc;
  iterator in_stack_fffffffffffffec0;
  _Self in_stack_fffffffffffffee8;
  _Self in_stack_fffffffffffffef0;
  _Self local_f8;
  _Self local_f0 [2];
  string local_e0 [32];
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_a4;
  undefined4 local_98;
  string local_88 [36];
  int local_64;
  reference local_60;
  MatchRecord *local_58;
  __normal_iterator<const_banksia::MatchRecord_*,_std::vector<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>_>
  local_50;
  long local_48;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>_>
         *)0x19b61e);
  local_48 = in_RSI + 0x200;
  local_50._M_current =
       (MatchRecord *)
       std::vector<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>::begin
                 ((vector<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_> *)
                  in_stack_fffffffffffffea8);
  local_58 = (MatchRecord *)
             std::vector<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>::end
                       ((vector<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_> *)
                        in_stack_fffffffffffffea8);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_banksia::MatchRecord_*,_std::vector<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>_>
                             *)in_stack_fffffffffffffeb0,
                            (__normal_iterator<const_banksia::MatchRecord_*,_std::vector<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>_>
                             *)in_stack_fffffffffffffea8), bVar2) {
    local_60 = __gnu_cxx::
               __normal_iterator<const_banksia::MatchRecord_*,_std::vector<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>_>
               ::operator*(&local_50);
    if ((local_60->result).result != noresult) {
      for (local_64 = 0; local_64 < 2; local_64 = local_64 + 1) {
        std::__cxx11::string::string(local_88,(string *)(local_60->playernames + local_64));
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          TourPlayer::TourPlayer(in_stack_fffffffffffffeb0);
          in_stack_fffffffffffffec0 =
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>_>
               ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>_>
                       *)in_stack_fffffffffffffea8,(key_type *)0x19b740);
          local_f0[0]._M_node = in_stack_fffffffffffffec0._M_node;
          local_f8._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>_>
               ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>_>
                      *)in_stack_fffffffffffffea8);
          bVar2 = std::operator==(local_f0,&local_f8);
          if (bVar2) {
            std::__cxx11::string::operator=(local_e0,local_88);
          }
          else {
            std::
            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>
            ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>
                          *)0x19b7c8);
            TourPlayer::operator=(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
          }
          uVar3 = std::__cxx11::string::empty();
          iVar1 = local_b4;
          if ((uVar3 & 1) != 0) {
            local_a4 = local_a4 + 1;
          }
          local_c0 = local_c0 + 1;
          in_stack_fffffffffffffebc = (local_60->result).result;
          if (in_stack_fffffffffffffebc == win) {
            if (local_64 == 1) {
              local_bc = local_bc + 1;
            }
            else {
              local_b4 = local_b4 + 1;
            }
          }
          else if (in_stack_fffffffffffffebc == draw) {
            local_b8 = local_b8 + 1;
          }
          else if (in_stack_fffffffffffffebc == loss) {
            if (local_64 == 0) {
              local_bc = local_bc + 1;
            }
            else {
              local_b4 = local_b4 + 1;
            }
          }
          if ((iVar1 < local_b4) &&
             ((((local_60->result).reason == illegalmove || ((local_60->result).reason == crash)) ||
              ((local_60->result).reason == timeout)))) {
            local_b0 = local_b0 + 1;
          }
          in_stack_fffffffffffffeb0 =
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>_>
                             *)in_stack_fffffffffffffef0._M_node,
                            (key_type *)in_stack_fffffffffffffee8._M_node);
          TourPlayer::operator=(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
          TourPlayer::~TourPlayer(in_stack_fffffffffffffeb0);
          local_98 = 0;
        }
        else {
          local_98 = 6;
        }
        std::__cxx11::string::~string(local_88);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_banksia::MatchRecord_*,_std::vector<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>_>
    ::operator++(&local_50);
  }
  std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::vector
            ((vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *)0x19b9c5);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>_>
  ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>_>
           *)in_stack_fffffffffffffea8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>_>
  ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>_>
         *)in_stack_fffffffffffffea8);
  while (bVar2 = std::operator!=((_Self *)&stack0xfffffffffffffef0,(_Self *)&stack0xfffffffffffffee8
                                ), bVar2) {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>
                 *)0x19ba0f);
    std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::push_back
              ((vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *)
               in_stack_fffffffffffffec0._M_node,
               (value_type *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>
                  *)in_stack_fffffffffffffeb0);
  }
  local_98 = 1;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>_>
          *)0x19ba85);
  return in_RDI;
}

Assistant:

std::vector<TourPlayer> TourMng::collectStats() const
{
    std::map<std::string, TourPlayer> resultMap;
    
    for(auto && m : matchRecordList) {
        if (m.result.result == ResultType::noresult) { // hm ?
            continue;
        }
        
        for(int sd = 0; sd < 2; sd++) {
            auto name = m.playernames[sd];
            if (name.empty()) { // bye players (in knockout) won without opponents
                continue;
            }
            
            TourPlayer r;
            auto it = resultMap.find(name);
            if (it == resultMap.end()) {
                r.name = name;
            } else {
                r = it->second; assert(r.name == name);
            }
            
            if (m.playernames[1 - sd].empty()) { // bye player
                r.byeCnt++;
            }
            
            auto lossCnt = r.lossCnt;
            r.gameCnt++;
            switch (m.result.result) {
                case ResultType::win:
                    if (sd == W) r.winCnt++; else r.lossCnt++;
                    break;
                case ResultType::draw:
                    r.drawCnt++;
                    break;
                case ResultType::loss:
                    if (sd == B) r.winCnt++; else r.lossCnt++;
                    break;
                default:
                    assert(false);
                    break;
            }
            
            if (lossCnt < r.lossCnt) {
                if (m.result.reason == ReasonType::illegalmove || m.result.reason == ReasonType::crash || m.result.reason == ReasonType::timeout) {
                    r.abnormalCnt++;
                }
            }
            resultMap[name] = r;
        }
    }
    
    std::vector<TourPlayer> resultList;
    for (auto && s : resultMap) {
        resultList.push_back(s.second);
    }
    return resultList;
}